

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
libcellml::Units::addUnit
          (Units *this,string *reference,int prefix,double exponent,double multiplier,string *id)

{
  string local_40;
  
  convertToString_abi_cxx11_(&local_40,(libcellml *)(ulong)(uint)prefix,prefix);
  addUnit(this,reference,&local_40,exponent,multiplier,id);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Units::addUnit(const std::string &reference, int prefix, double exponent,
                    double multiplier, const std::string &id)
{
    addUnit(reference, convertToString(prefix), exponent, multiplier, id);
}